

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_tst_8_pcdi(void)

{
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    m68ki_cpu.n_flag = OPER_PCDI_8();
    m68ki_cpu.not_z_flag = m68ki_cpu.n_flag;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_tst_8_pcdi(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint res = OPER_PCDI_8();

		FLAG_N = NFLAG_8(res);
		FLAG_Z = res;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;
		return;
	}
	m68ki_exception_illegal();
}